

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplePosRasterizationTest::init
          (SamplePosRasterizationTest *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
  *this_00;
  TestLog *pTVar1;
  Context *pCVar2;
  RenderContext *pRVar3;
  pointer pTVar4;
  pointer pVVar5;
  SamplePosRasterizationTest *pSVar6;
  GLuint *pGVar7;
  bool bVar8;
  int iVar9;
  deUint32 dVar10;
  undefined4 uVar11;
  GLint GVar12;
  int extraout_EAX;
  undefined4 extraout_var;
  RenderTarget *pRVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ShaderProgram *this_01;
  long *plVar14;
  NotSupportedError *pNVar15;
  TestError *pTVar16;
  char *pcVar17;
  string *description;
  pointer ppSVar18;
  long lVar19;
  int i;
  long lVar20;
  float fVar21;
  float fVar22;
  StateQueryMemoryWriteGuard<float[2]> position;
  GLint maxSamples;
  GLuint fboID;
  ScopedLogSection section;
  ShaderProgram program;
  undefined1 local_348 [8];
  undefined1 auStack_340 [8];
  undefined1 local_338 [24];
  SamplePosRasterizationTest *local_320;
  int local_314;
  string local_310;
  undefined1 local_2f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  int *local_2c8;
  float local_2bc;
  undefined1 local_2b8 [4];
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  ios_base local_240 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_228;
  undefined1 local_208 [208];
  string local_138;
  GLuint *local_118;
  GLuint *local_110;
  GLuint *local_108;
  undefined1 local_100 [16];
  undefined1 local_f0 [136];
  deUint32 local_68;
  bool local_40;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar20 = CONCAT44(extraout_var,iVar9);
  local_314 = 0;
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_2c8 = &this->m_canvasSize;
  if (this->m_canvasSize <= pRVar13->m_width) {
    pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (this->m_canvasSize <= pRVar13->m_height) {
      (**(code **)(lVar20 + 0x868))(0x910e,&local_314);
      if (local_314 < this->m_samples) {
        pNVar15 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        _local_2b8 = (pointer)&local_2a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b8,
                   "Requested sample count is greater than GL_MAX_COLOR_TEXTURE_SAMPLES","");
        tcu::NotSupportedError::NotSupportedError(pNVar15,(string *)local_2b8);
        __cxa_throw(pNVar15,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2b8 = SUB84(pTVar1,0);
      fStack_2b4 = (float)((ulong)pTVar1 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_2b0,"GL_MAX_COLOR_TEXTURE_SAMPLES = ",0x1f);
      std::ostream::operator<<((ostringstream *)&fStack_2b0,local_314);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2b0);
      std::ios_base::~ios_base(local_240);
      (**(code **)(lVar20 + 0x868))(0xd50,&this->m_subpixelBits);
      pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2b8 = SUB84(pTVar1,0);
      fStack_2b4 = (float)((ulong)pTVar1 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_2b0,"GL_SUBPIXEL_BITS = ",0x13);
      std::ostream::operator<<((ostringstream *)&fStack_2b0,this->m_subpixelBits);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2b0);
      std::ios_base::~ios_base(local_240);
      pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2b8 = SUB84(pTVar1,0);
      fStack_2b4 = (float)((ulong)pTVar1 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_2b0,"Creating multisample texture",0x1c);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2b0);
      std::ios_base::~ios_base(local_240);
      local_108 = &this->m_texID;
      iVar9 = 1;
      (**(code **)(lVar20 + 0x6f8))(1);
      (**(code **)(lVar20 + 0xb8))(0x9100,this->m_texID);
      (**(code **)(lVar20 + 0x1390))
                (0x9100,this->m_samples,0x8058,this->m_canvasSize,this->m_canvasSize,1);
      dVar10 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar10,"texStorage2DMultisample",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0xe3);
      local_110 = &this->m_vaoID;
      (**(code **)(lVar20 + 0x708))(1);
      (**(code **)(lVar20 + 0xd8))(this->m_vaoID);
      dVar10 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar10,"bindVertexArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0xe7);
      local_118 = &this->m_vboID;
      (**(code **)(lVar20 + 0x6c8))(1);
      (**(code **)(lVar20 + 0x40))(0x8892,this->m_vboID);
      dVar10 = (**(code **)(lVar20 + 0x800))();
      pcVar17 = (char *)0xeb;
      glu::checkError(dVar10,"bindBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0xeb);
      this_00 = &this->m_testTriangles;
      local_320 = this;
      do {
        local_2b8 = (undefined1  [4])((1.0 / (float)iVar9 + (float)(iVar9 + -1)) / 20.0);
        fStack_2b4 = 0.0;
        fStack_2b0 = 0.0;
        fStack_2ac = 1.0;
        local_2a8._M_allocated_capacity._0_4_ =
             ((float)(iVar9 + -1) + 0.3 + 1.0 / (float)iVar9) / 20.0;
        local_2a8._M_allocated_capacity._4_4_ = 0.0;
        local_2a8._8_4_ = 0.0;
        local_2a8._12_4_ = 1.0;
        fStack_294 = -1.0;
        fStack_290 = 0.0;
        fStack_28c = 1.0;
        local_298 = (float)local_2b8;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
        ::push_back(this_00,(value_type *)local_2b8);
        iVar9 = iVar9 + 1;
      } while (iVar9 != 0x15);
      iVar9 = 1;
      do {
        fStack_2b4 = (1.0 / (float)iVar9 + (float)(iVar9 + -1)) / 20.0;
        local_2b8 = (undefined1  [4])0xbf800000;
        fStack_2b0 = 0.0;
        fStack_2ac = 1.0;
        local_2a8._M_allocated_capacity._4_4_ =
             ((float)(iVar9 + -1) + 0.3 + 1.0 / (float)iVar9) / 20.0;
        local_2a8._M_allocated_capacity._0_4_ = -1.0;
        local_2a8._8_4_ = 0.0;
        local_2a8._12_4_ = 1.0;
        local_298 = 0.0;
        fStack_290 = 0.0;
        fStack_28c = 1.0;
        fStack_294 = fStack_2b4;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
        ::push_back(this_00,(value_type *)local_2b8);
        pSVar6 = local_320;
        iVar9 = iVar9 + 1;
      } while (iVar9 != 0x15);
      iVar9 = 0;
      do {
        local_2bc = ((float)iVar9 / 20.0) * 3.1415927;
        local_2bc = local_2bc + local_2bc;
        fVar21 = cosf(local_2bc);
        fVar22 = fVar21 * 0.5 + 0.5;
        fVar21 = sinf(local_2bc);
        local_2a8._M_allocated_capacity._4_4_ = fVar21 * 0.5 + 0.5;
        local_2b8 = (undefined1  [4])0x3ecccccd;
        fStack_2b4 = 0.4;
        fStack_2b0 = 0.0;
        fStack_2ac = 1.0;
        local_2a8._8_4_ = 0.0;
        local_2a8._12_4_ = 1.0;
        local_298 = fVar22 + 0.1;
        fStack_294 = (float)local_2a8._M_allocated_capacity._4_4_ + 0.02;
        fStack_290 = 0.0;
        fStack_28c = 1.0;
        local_2a8._M_allocated_capacity._0_4_ = fVar22;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
        ::push_back(this_00,(value_type *)local_2b8);
        iVar9 = iVar9 + 1;
      } while (iVar9 != 0x14);
      local_2b8 = (undefined1  [4])0xbe4ed917;
      fStack_2b4 = -0.202;
      fStack_2b0 = 0.0;
      fStack_2ac = 1.0;
      local_2a8._M_allocated_capacity._0_4_ = -0.802;
      local_2a8._M_allocated_capacity._4_4_ = -0.202;
      local_2a8._8_4_ = 0.0;
      local_2a8._12_4_ = 1.0;
      local_298 = -0.802;
      fStack_294 = -0.802;
      fStack_290 = 0.0;
      fStack_28c = 1.0;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
      ::push_back(this_00,(value_type *)local_2b8);
      iVar9 = (*((pSVar6->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      lVar20 = CONCAT44(extraout_var_00,iVar9);
      pCVar2 = (pSVar6->super_TestCase).m_context;
      pRVar3 = pCVar2->m_renderCtx;
      local_208[0x10] = 0;
      local_208._17_8_ = 0;
      local_208._0_8_ = (pointer)0x0;
      local_208[8] = 0;
      local_208._9_7_ = 0;
      memset(local_2b8,0,0xac);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_310,(_anonymous_namespace_ *)pCVar2,
                 (Context *)
                 "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
                 ,pcVar17);
      local_348 = (undefined1  [8])((ulong)(uint)local_348._4_4_ << 0x20);
      auStack_340 = (undefined1  [8])(local_338 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_340,local_310._M_dataplus._M_p,
                 local_310._M_dataplus._M_p + local_310._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2b8 + ((ulong)local_348 & 0xffffffff) * 0x18),(value_type *)auStack_340)
      ;
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_138,(_anonymous_namespace_ *)(pSVar6->super_TestCase).m_context,
                 (Context *)
                 "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
                 ,pcVar17);
      local_2f0._0_4_ = 1;
      local_2f0._8_8_ = local_2e0._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_2f0 + 8),local_138._M_dataplus._M_p,
                 local_138._M_dataplus._M_p + local_138._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2b8 + (ulong)(uint)local_2f0._0_4_ * 0x18),(value_type *)(local_2f0 + 8)
                 );
      glu::ShaderProgram::ShaderProgram
                ((ShaderProgram *)local_100,pRVar3,(ProgramSources *)local_2b8);
      if ((char *)local_2f0._8_8_ != local_2e0._M_local_buf + 8) {
        operator_delete((void *)local_2f0._8_8_,local_2e0._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if (auStack_340 != (undefined1  [8])(local_338 + 8)) {
        operator_delete((void *)auStack_340,local_338._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_208);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_228);
      lVar19 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2b8 + lVar19));
        lVar19 = lVar19 + -0x18;
      } while (lVar19 != -0x18);
      uVar11 = (**(code **)(lVar20 + 0x780))(local_68,"a_position");
      pGVar7 = local_108;
      pSVar6 = local_320;
      local_2f0._0_4_ = 0;
      if (local_40 == false) {
        glu::operator<<(((local_320->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
                        ,(ShaderProgram *)local_100);
        pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
        _local_2b8 = (pointer)&local_2a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b8,"Failed to build shader.","");
        tcu::TestError::TestError(pTVar16,(string *)local_2b8);
        __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar20 + 0xb8))(0x9100,*local_108);
      (**(code **)(lVar20 + 0xd8))(*local_110);
      (**(code **)(lVar20 + 0x40))(0x8892,*local_118);
      pTVar1 = ((pSVar6->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2b8 = SUB84(pTVar1,0);
      fStack_2b4 = (float)((ulong)pTVar1 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_2b0,"Attaching texture to FBO",0x18);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2b0);
      std::ios_base::~ios_base(local_240);
      (**(code **)(lVar20 + 0x6d0))(1,local_2f0);
      (**(code **)(lVar20 + 0x78))(0x8d40,local_2f0._0_4_);
      (**(code **)(lVar20 + 0x6a0))(0x8d40,0x8ce0,0x9100,*pGVar7,0);
      dVar10 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar10,"framebufferTexture2D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x17a);
      pTVar1 = ((pSVar6->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2b8 = SUB84(pTVar1,0);
      fStack_2b4 = (float)((ulong)pTVar1 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_2b0,"Sample locations:",0x11);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2b0);
      std::ios_base::~ios_base(local_240);
      if (0 < pSVar6->m_samples) {
        iVar9 = 0;
        do {
          local_338._0_4_ = -8.0297587e+18;
          local_338._4_4_ = -8.0297587e+18;
          local_348._0_4_ = -8.0297587e+18;
          local_348._4_4_ = -8.0297587e+18;
          auStack_340 = (undefined1  [8])0xdededededededede;
          (**(code **)(lVar20 + 0x8e8))(0x8e50,iVar9,auStack_340);
          bVar8 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[2]>::verifyValidity
                            ((StateQueryMemoryWriteGuard<float[2]> *)local_348,
                             (pSVar6->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          if (!bVar8) {
            pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
            _local_2b8 = (pointer)&local_2a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2b8,"Error while querying sample positions","");
            tcu::TestError::TestError(pTVar16,(string *)local_2b8);
            __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          pTVar1 = ((pSVar6->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          local_2b8 = SUB84(pTVar1,0);
          fStack_2b4 = (float)((ulong)pTVar1 >> 0x20);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_2b0,"\t",1);
          std::ostream::operator<<((ostringstream *)&fStack_2b0,iVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_2b0,": (",3);
          std::ostream::_M_insert<double>((double)(float)auStack_340._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_2b0,", ",2);
          std::ostream::_M_insert<double>((double)(float)auStack_340._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_2b0,")",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2b0);
          std::ios_base::~ios_base(local_240);
          local_2b8 = auStack_340._0_4_;
          fStack_2b4 = auStack_340._4_4_;
          std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
          emplace_back<tcu::Vector<float,2>>
                    ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)
                     &pSVar6->m_samplePositions,(Vector<float,_2> *)local_2b8);
          iVar9 = iVar9 + 1;
        } while (iVar9 < pSVar6->m_samples);
      }
      pTVar1 = ((pSVar6->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2b8 = SUB84(pTVar1,0);
      fStack_2b4 = (float)((ulong)pTVar1 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_2b0,"Drawing test pattern to the texture",0x23);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2b0);
      std::ios_base::~ios_base(local_240);
      pTVar4 = (pSVar6->m_testTriangles).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (**(code **)(lVar20 + 0x150))
                (0x8892,(long)(pSVar6->m_testTriangles).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4,pTVar4,
                 0x88e4);
      dVar10 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar10,"bufferData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x192);
      (**(code **)(lVar20 + 0x1a00))(0,0,*local_2c8);
      (**(code **)(lVar20 + 0x1c0))(0,0,0,0x3f800000);
      (**(code **)(lVar20 + 0x188))(0x4000);
      (**(code **)(lVar20 + 0x19f0))(uVar11,4,0x1406,0,0,0);
      (**(code **)(lVar20 + 0x610))(uVar11);
      dVar10 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar10,"vertexAttribPointer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x199);
      (**(code **)(lVar20 + 0x1680))(local_68);
      (**(code **)(lVar20 + 0x538))
                (4,0,(ulong)((long)(pSVar6->m_testTriangles).
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pSVar6->m_testTriangles).
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
      dVar10 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar10,"drawArrays",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x19d);
      (**(code **)(lVar20 + 0x518))(uVar11);
      (**(code **)(lVar20 + 0x1680))(0);
      (**(code **)(lVar20 + 0x440))(1,local_2f0);
      dVar10 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar10,"cleanup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x1a2);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
      if (0 < (long)pSVar6->m_samples) {
        pVVar5 = (pSVar6->m_samplePositions).
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar9 = 0;
        lVar20 = 0;
        do {
          fVar21 = *(float *)((long)pVVar5->m_data + lVar20);
          if ((((fVar21 < 0.0) || (1.0 < fVar21)) ||
              (fVar21 = *(float *)((long)pVVar5->m_data + lVar20 + 4), fVar21 < 0.0)) ||
             (1.0 < fVar21)) {
            pTVar1 = ((pSVar6->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            local_2b8 = SUB84(pTVar1,0);
            fStack_2b4 = (float)((ulong)pTVar1 >> 0x20);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&fStack_2b0,"// ERROR: Sample position of sample ",0x24);
            std::ostream::operator<<((ostringstream *)&fStack_2b0,iVar9);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&fStack_2b0," should be in range ([0, 1], [0, 1]). Got ",0x2a);
            tcu::operator<<((ostream *)&fStack_2b0,
                            (Vector<float,_2> *)
                            ((long)((local_320->m_samplePositions).
                                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar20));
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2b0);
            std::ios_base::~ios_base(local_240);
            pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
            _local_2b8 = (pointer)&local_2a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2b8,"invalid sample position","");
            tcu::TestError::TestError(pTVar16,(string *)local_2b8);
            __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          lVar20 = lVar20 + 8;
          iVar9 = iVar9 + 1;
        } while ((long)pSVar6->m_samples * 8 != lVar20);
      }
      pTVar1 = ((pSVar6->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_100._0_8_ = (pointer)0x17;
      _local_2b8 = (pointer)&local_2a8;
      pcVar17 = (char *)std::__cxx11::string::_M_create((ulong *)local_2b8,(ulong)local_100);
      local_2b8 = SUB84(pcVar17,0);
      fStack_2b4 = (float)((ulong)pcVar17 >> 0x20);
      local_2a8._M_allocated_capacity._0_4_ = (undefined4)local_100._0_8_;
      local_2a8._M_allocated_capacity._4_4_ = SUB84(local_100._0_8_,4);
      builtin_strncpy(pcVar17,"Generate sampler shader",0x17);
      pcVar17[local_100._0_8_] = '\0';
      local_348._0_4_ = 3.22299e-44;
      local_348._4_4_ = 0.0;
      fStack_2b0 = (float)local_2a8._M_allocated_capacity._0_4_;
      fStack_2ac = (float)local_2a8._M_allocated_capacity._4_4_;
      local_100._0_8_ = local_f0;
      local_100._0_8_ = std::__cxx11::string::_M_create((ulong *)local_100,(ulong)local_348);
      description = (string *)local_100;
      local_f0._0_8_ = local_348;
      *(undefined8 *)local_100._0_8_ = 0x65746172656e6547;
      *(undefined8 *)(local_100._0_8_ + 8) = 0x72656c706d617320;
      builtin_strncpy((char *)(local_100._0_8_ + 0xf),"r shader",8);
      local_100._8_8_ = local_348;
      *(char *)(local_100._0_8_ + (long)local_348) = '\0';
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&local_138,pTVar1,(string *)local_2b8,description);
      pSVar6 = local_320;
      if ((undefined1 *)local_100._0_8_ != local_f0) {
        operator_delete((void *)local_100._0_8_,local_f0._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(fStack_2b4,local_2b8) != &local_2a8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fStack_2b4,local_2b8),
                        CONCAT44(local_2a8._M_allocated_capacity._4_4_,
                                 local_2a8._M_allocated_capacity._0_4_) + 1);
      }
      iVar9 = (*((pSVar6->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      lVar20 = CONCAT44(extraout_var_01,iVar9);
      this_01 = (ShaderProgram *)operator_new(0xd0);
      pCVar2 = (pSVar6->super_TestCase).m_context;
      pRVar3 = pCVar2->m_renderCtx;
      local_208[0x10] = 0;
      local_208._17_8_ = 0;
      local_208._0_8_ = (pointer)0x0;
      local_208[8] = 0;
      local_208._9_7_ = 0;
      memset(local_2b8,0,0xac);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                ((string *)local_2f0,(_anonymous_namespace_ *)pCVar2,
                 (Context *)
                 "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
                 ,(char *)description);
      local_100._0_8_ = local_100._0_8_ & 0xffffffff00000000;
      local_100._8_8_ = local_f0 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_100 + 8),CONCAT44(local_2f0._4_4_,local_2f0._0_4_),
                 (char *)(local_2f0._8_8_ + CONCAT44(local_2f0._4_4_,local_2f0._0_4_)));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2b8 + (local_100._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_100 + 8));
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_310,(_anonymous_namespace_ *)(pSVar6->super_TestCase).m_context,
                 (Context *)
                 "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp vec4 fragColor;\nuniform highp sampler2DMS u_sampler;\nuniform highp int u_sample;\nvoid main (void)\n{\n\tfragColor = texelFetch(u_sampler, ivec2(int(floor(gl_FragCoord.x)), int(floor(gl_FragCoord.y))), u_sample);\n}\n"
                 ,(char *)description);
      local_348._0_4_ = 1.4013e-45;
      auStack_340 = (undefined1  [8])(local_338 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_340,local_310._M_dataplus._M_p,
                 local_310._M_dataplus._M_p + local_310._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2b8 + ((ulong)local_348 & 0xffffffff) * 0x18),(value_type *)auStack_340)
      ;
      glu::ShaderProgram::ShaderProgram(this_01,pRVar3,(ProgramSources *)local_2b8);
      pSVar6->m_samplerProgram = this_01;
      if (auStack_340 != (undefined1  [8])(local_338 + 8)) {
        operator_delete((void *)auStack_340,local_338._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_100._8_8_ != local_f0 + 8) {
        operator_delete((void *)local_100._8_8_,local_f0._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_2f0._4_4_,local_2f0._0_4_) != &local_2e0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_2f0._4_4_,local_2f0._0_4_),
                        local_2e0._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_208);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_228);
      lVar19 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2b8 + lVar19));
        pSVar6 = local_320;
        lVar19 = lVar19 + -0x18;
      } while (lVar19 != -0x18);
      glu::operator<<(((local_320->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      local_320->m_samplerProgram);
      if ((pSVar6->m_samplerProgram->m_program).m_info.linkOk != false) {
        GVar12 = (**(code **)(lVar20 + 0x780))
                           ((pSVar6->m_samplerProgram->m_program).m_program,"a_position");
        pSVar6->m_samplerProgramPosLoc = GVar12;
        GVar12 = (**(code **)(lVar20 + 0xb48))
                           ((pSVar6->m_samplerProgram->m_program).m_program,"u_sampler");
        pSVar6->m_samplerProgramSamplerLoc = GVar12;
        GVar12 = (**(code **)(lVar20 + 0xb48))
                           ((pSVar6->m_samplerProgram->m_program).m_program,"u_sample");
        pSVar6->m_samplerProgramSampleNdxLoc = GVar12;
        tcu::TestLog::endSection((TestLog *)local_138._M_dataplus._M_p);
        return extraout_EAX;
      }
      pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
      _local_2b8 = (pointer)&local_2a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b8,"Could not create sampler program.","");
      tcu::TestError::TestError(pTVar16,(string *)local_2b8);
      __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pNVar15 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  de::toString<int>((string *)local_2f0,local_2c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 "render target size must be at least ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0);
  plVar14 = (long *)std::__cxx11::string::append(local_348);
  local_100._0_8_ = *plVar14;
  ppSVar18 = (pointer)(plVar14 + 2);
  if ((pointer)local_100._0_8_ == ppSVar18) {
    local_f0._0_8_ = *ppSVar18;
    local_f0._8_8_ = plVar14[3];
    local_100._0_8_ = local_f0;
  }
  else {
    local_f0._0_8_ = *ppSVar18;
  }
  local_100._8_8_ = plVar14[1];
  *plVar14 = (long)ppSVar18;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  de::toString<int>(&local_310,local_2c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 &local_310);
  tcu::NotSupportedError::NotSupportedError(pNVar15,(string *)local_2b8);
  __cxa_throw(pNVar15,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SamplePosRasterizationTest::init (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	GLint					maxSamples	= 0;

	// requirements

	if (m_context.getRenderTarget().getWidth() < m_canvasSize || m_context.getRenderTarget().getHeight() < m_canvasSize)
		throw tcu::NotSupportedError("render target size must be at least " + de::toString(m_canvasSize) + "x" + de::toString(m_canvasSize));

	gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &maxSamples);
	if (m_samples > maxSamples)
		throw tcu::NotSupportedError("Requested sample count is greater than GL_MAX_COLOR_TEXTURE_SAMPLES");

	m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_COLOR_TEXTURE_SAMPLES = " << maxSamples << tcu::TestLog::EndMessage;

	gl.getIntegerv(GL_SUBPIXEL_BITS, &m_subpixelBits);
	m_testCtx.getLog() << tcu::TestLog::Message << "GL_SUBPIXEL_BITS = " << m_subpixelBits << tcu::TestLog::EndMessage;

	// generate textures & other gl stuff

	m_testCtx.getLog() << tcu::TestLog::Message << "Creating multisample texture" << tcu::TestLog::EndMessage;

	gl.genTextures				(1, &m_texID);
	gl.bindTexture				(GL_TEXTURE_2D_MULTISAMPLE, m_texID);
	gl.texStorage2DMultisample	(GL_TEXTURE_2D_MULTISAMPLE, m_samples, GL_RGBA8, m_canvasSize, m_canvasSize, GL_TRUE);
	GLU_EXPECT_NO_ERROR			(gl.getError(), "texStorage2DMultisample");

	gl.genVertexArrays		(1, &m_vaoID);
	gl.bindVertexArray		(m_vaoID);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "bindVertexArray");

	gl.genBuffers			(1, &m_vboID);
	gl.bindBuffer			(GL_ARRAY_BUFFER, m_vboID);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "bindBuffer");

	// generate test scene
	for (int i = 0; i < 20; ++i)
	{
		// vertical spikes
		Triangle tri;
		tri.p1 = tcu::Vec4(((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	 0.0f,	0.0f,	1.0f);
		tri.p2 = tcu::Vec4(((float)i + 0.3f + 1.0f / (float)(i + 1)) / 20.0f,	 0.0f,	0.0f,	1.0f);
		tri.p3 = tcu::Vec4(((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	-1.0f,	0.0f,	1.0f);
		m_testTriangles.push_back(tri);
	}
	for (int i = 0; i < 20; ++i)
	{
		// horisontal spikes
		Triangle tri;
		tri.p1 = tcu::Vec4(-1.0f,	((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	0.0f,	1.0f);
		tri.p2 = tcu::Vec4(-1.0f,	((float)i + 0.3f + 1.0f / (float)(i + 1)) / 20.0f,	0.0f,	1.0f);
		tri.p3 = tcu::Vec4( 0.0f,	((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	0.0f,	1.0f);
		m_testTriangles.push_back(tri);
	}

	for (int i = 0; i < 20; ++i)
	{
		// fan
		const tcu::Vec2 p = tcu::Vec2(deFloatCos(((float)i)/20.0f*DE_PI*2) * 0.5f + 0.5f, deFloatSin(((float)i)/20.0f*DE_PI*2) * 0.5f + 0.5f);
		const tcu::Vec2 d = tcu::Vec2(0.1f, 0.02f);

		Triangle tri;
		tri.p1 = tcu::Vec4(0.4f,			0.4f,			0.0f,	1.0f);
		tri.p2 = tcu::Vec4(p.x(),			p.y(),			0.0f,	1.0f);
		tri.p3 = tcu::Vec4(p.x() + d.x(),	p.y() + d.y(),	0.0f,	1.0f);
		m_testTriangles.push_back(tri);
	}
	{
		Triangle tri;
		tri.p1 = tcu::Vec4(-0.202f, -0.202f, 0.0f, 1.0f);
		tri.p2 = tcu::Vec4(-0.802f, -0.202f, 0.0f, 1.0f);
		tri.p3 = tcu::Vec4(-0.802f, -0.802f, 0.0f, 1.0f);
		m_testTriangles.push_back(tri);
	}

	// generate multisample texture (and query the sample positions in it)
	genMultisampleTexture();

	// verify queried samples are in a valid range
	for (int sampleNdx = 0; sampleNdx < m_samples; ++sampleNdx)
	{
		if (m_samplePositions[sampleNdx].x() < 0.0f || m_samplePositions[sampleNdx].x() > 1.0f ||
			m_samplePositions[sampleNdx].y() < 0.0f || m_samplePositions[sampleNdx].y() > 1.0f)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "// ERROR: Sample position of sample " << sampleNdx << " should be in range ([0, 1], [0, 1]). Got " << m_samplePositions[sampleNdx] << tcu::TestLog::EndMessage;
			throw tcu::TestError("invalid sample position");
		}
	}

	// generate sampler program
	genSamplerProgram();
}